

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_INT32 *pOVar3;
  FILE *pFVar4;
  size_t sVar5;
  undefined8 uVar6;
  opj_image_comp_t *poVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  OPJ_UINT32 *pOVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  uint *puVar19;
  int local_70;
  int local_6c;
  uint *local_68;
  uint *local_60;
  
  poVar7 = image->comps;
  OVar1 = poVar7->prec;
  pcVar18 = outfile;
  if ((int)OVar1 < 0x11) {
    do {
      pcVar8 = pcVar18;
      pcVar18 = pcVar8 + 1;
    } while (*pcVar8 != '\0');
    uVar13 = image->numcomps;
    uVar11 = 1;
    if ((pcVar8[-2] & 0xdfU) != 0x47) {
      uVar11 = uVar13;
    }
    if ((force_split == 0) && (1 < uVar11)) {
      if (1 < uVar13) {
        pOVar12 = &poVar7[1].sgnd;
        uVar15 = 1;
        do {
          if (((poVar7->dx != ((opj_image_comp_t *)(pOVar12 + -8))->dx) ||
              (poVar7->dy != pOVar12[-7])) ||
             ((uVar15 < 3 && ((OVar1 != pOVar12[-2] || (poVar7->sgnd != *pOVar12))))))
          goto LAB_0010bf6b;
          uVar15 = uVar15 + 1;
          pOVar12 = pOVar12 + 0x10;
        } while (uVar13 != uVar15);
      }
      pFVar4 = fopen(outfile,"wb");
      if (pFVar4 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
      }
      else {
        poVar7 = image->comps;
        pOVar3 = poVar7->data;
        if (pOVar3 != (OPJ_INT32 *)0x0) {
          OVar2 = poVar7->w;
          uVar13 = poVar7->h;
          if (uVar11 < 3) {
            local_68 = (uint *)0x0;
            local_60 = (uint *)0x0;
          }
          else {
            local_60 = (uint *)poVar7[1].data;
            if ((local_60 == (uint *)0x0) ||
               (local_68 = (uint *)poVar7[2].data, local_68 == (uint *)0x0)) {
              imagetopnm_cold_4();
              return 1;
            }
          }
          uVar10 = ~(-1 << ((byte)OVar1 & 0x1f));
          if ((uVar11 == 4) || (uVar11 == 2)) {
            pcVar18 = "GRAYSCALE_ALPHA";
            if (2 < uVar11) {
              pcVar18 = "RGB_ALPHA";
            }
            uVar6 = opj_version();
            iVar16 = 0;
            fprintf(pFVar4,
                    "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n"
                    ,uVar6,OVar2,(ulong)uVar13,(ulong)uVar11,(ulong)uVar10,pcVar18);
            poVar7 = image->comps;
            puVar19 = (uint *)poVar7[(ulong)uVar11 - 1].data;
            if (poVar7[(ulong)uVar11 - 1].sgnd != 0) {
              iVar16 = 1 << ((char)poVar7[(ulong)uVar11 - 1].prec - 1U & 0x1f);
            }
          }
          else {
            uVar6 = opj_version();
            iVar16 = 0;
            fprintf(pFVar4,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar6,OVar2,(ulong)uVar13,(ulong)uVar10)
            ;
            poVar7 = image->comps;
            puVar19 = (uint *)0x0;
          }
          local_6c = 0;
          iVar9 = 0;
          if (poVar7->sgnd != 0) {
            iVar9 = 1 << ((char)poVar7->prec - 1U & 0x1f);
          }
          local_70 = 0;
          if (2 < uVar11) {
            local_70 = 0;
            local_6c = 0;
            if (poVar7[1].sgnd != 0) {
              local_6c = 1 << ((char)poVar7[1].prec - 1U & 0x1f);
            }
            if (poVar7[2].sgnd != 0) {
              local_70 = 1 << ((char)poVar7[2].prec - 1U & 0x1f);
            }
          }
          if (0 < (int)(uVar13 * OVar2)) {
            lVar17 = 0;
            do {
              uVar10 = pOVar3[lVar17];
              if ((int)OVar1 < 9) {
                uVar14 = 0;
                if (0 < (int)uVar10) {
                  uVar14 = uVar10;
                }
                uVar14 = uVar14 & 0xff;
                if (0xff < (int)uVar10) {
                  uVar14 = 0xff;
                }
                fputc(uVar14,pFVar4);
                if (2 < uVar11) {
                  uVar10 = *local_60;
                  local_60 = local_60 + 1;
                  uVar14 = 0;
                  if (0 < (int)uVar10) {
                    uVar14 = uVar10;
                  }
                  uVar14 = uVar14 & 0xff;
                  if (0xff < (int)uVar10) {
                    uVar14 = 0xff;
                  }
                  fputc(uVar14,pFVar4);
                  uVar10 = *local_68;
                  local_68 = local_68 + 1;
                  uVar14 = 0;
                  if (0 < (int)uVar10) {
                    uVar14 = uVar10;
                  }
                  uVar14 = uVar14 & 0xff;
                  if (0xff < (int)uVar10) {
                    uVar14 = 0xff;
                  }
                  fputc(uVar14,pFVar4);
                }
                if ((uVar11 == 4) || (uVar11 == 2)) {
                  uVar10 = *puVar19;
                  puVar19 = puVar19 + 1;
                  uVar14 = 0;
                  if (0 < (int)uVar10) {
                    uVar14 = uVar10;
                  }
                  uVar14 = uVar14 & 0xff;
                  if (0xff < (int)uVar10) {
                    uVar14 = 0xff;
                  }
                  fputc(uVar14,pFVar4);
                }
              }
              else {
                uVar10 = uVar10 + iVar9;
                if ((int)uVar10 < 1) {
                  uVar10 = 0;
                }
                if (0xfffe < (int)uVar10) {
                  uVar10 = 0xffff;
                }
                fprintf(pFVar4,"%c%c",(ulong)(uVar10 >> 8));
                if (2 < uVar11) {
                  uVar10 = *local_60 + local_6c;
                  local_60 = local_60 + 1;
                  if ((int)uVar10 < 1) {
                    uVar10 = 0;
                  }
                  if (0xfffe < (int)uVar10) {
                    uVar10 = 0xffff;
                  }
                  fprintf(pFVar4,"%c%c",(ulong)(uVar10 >> 8),(ulong)(uVar10 & 0xff));
                  uVar10 = *local_68 + local_70;
                  local_68 = local_68 + 1;
                  if ((int)uVar10 < 1) {
                    uVar10 = 0;
                  }
                  if (0xfffe < (int)uVar10) {
                    uVar10 = 0xffff;
                  }
                  fprintf(pFVar4,"%c%c",(ulong)(uVar10 >> 8));
                }
                if ((uVar11 == 4) || (uVar11 == 2)) {
                  uVar10 = *puVar19 + iVar16;
                  puVar19 = puVar19 + 1;
                  if ((int)uVar10 < 1) {
                    uVar10 = 0;
                  }
                  uVar15 = (ulong)uVar10;
                  if (0xfffe < (int)uVar10) {
                    uVar15 = 0xffff;
                  }
                  fprintf(pFVar4,"%c%c",uVar15 >> 8);
                }
              }
              lVar17 = lVar17 + 1;
            } while (uVar13 * OVar2 != (int)lVar17);
          }
          fclose(pFVar4);
          return 0;
        }
        imagetopnm_cold_5();
      }
    }
    else {
LAB_0010bf6b:
      if (uVar11 < uVar13) {
        imagetopnm_cold_1();
      }
      sVar5 = strlen(outfile);
      pcVar18 = (char *)malloc(sVar5 + 8);
      if (pcVar18 != (char *)0x0) {
        if (uVar11 != 0) {
          uVar15 = 0;
          do {
            if (uVar11 < 2) {
              strcpy(pcVar18,outfile);
            }
            else {
              sVar5 = strlen(outfile);
              memcpy(pcVar18,outfile,sVar5 - 4);
              sprintf(pcVar18 + (sVar5 - 4),"_%u.pgm",uVar15 & 0xffffffff);
            }
            pFVar4 = fopen(pcVar18,"wb");
            if (pFVar4 == (FILE *)0x0) {
              imagetopnm_cold_2();
              return 1;
            }
            poVar7 = image->comps;
            uVar13 = poVar7[uVar15].w;
            uVar10 = poVar7[uVar15].h;
            OVar1 = poVar7[uVar15].prec;
            uVar6 = opj_version();
            fprintf(pFVar4,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar6,(ulong)uVar13,(ulong)uVar10,
                    (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f)));
            poVar7 = image->comps;
            pOVar3 = poVar7[uVar15].data;
            if (pOVar3 != (OPJ_INT32 *)0x0) {
              if (poVar7[uVar15].sgnd == 0) {
                iVar16 = 0;
              }
              else {
                iVar16 = 1 << ((char)poVar7[uVar15].prec - 1U & 0x1f);
              }
              iVar9 = uVar10 * uVar13;
              if ((int)OVar1 < 9) {
                if (0 < iVar9) {
                  lVar17 = 0;
                  do {
                    uVar10 = pOVar3[lVar17] + iVar16;
                    uVar13 = 0;
                    if (0 < (int)uVar10) {
                      uVar13 = uVar10;
                    }
                    uVar13 = uVar13 & 0xff;
                    if (0xff < (int)uVar10) {
                      uVar13 = 0xff;
                    }
                    fputc(uVar13,pFVar4);
                    lVar17 = lVar17 + 1;
                  } while (iVar9 != (int)lVar17);
                }
              }
              else if (0 < iVar9) {
                lVar17 = 0;
                do {
                  uVar13 = pOVar3[lVar17] + iVar16;
                  if (pOVar3[lVar17] + iVar16 < 1) {
                    uVar13 = 0;
                  }
                  if (0xfffe < (int)uVar13) {
                    uVar13 = 0xffff;
                  }
                  fprintf(pFVar4,"%c%c",(ulong)(uVar13 >> 8),(ulong)uVar13 & 0xff);
                  lVar17 = lVar17 + 1;
                } while (iVar9 != (int)lVar17);
              }
            }
            fclose(pFVar4);
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar11);
        }
        free(pcVar18);
        return 0;
      }
      imagetopnm_cold_3();
    }
  }
  else {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/bin/jp2/convert.c"
            ,0x7ef,OVar1);
  }
  return 1;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if ((prec = (int)image->comps[0].prec) > 16) {
        fprintf(stderr, "%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n", __FILE__, __LINE__, prec);
        return 1;
    }
    two = has_alpha = 0;
    fails = 1;
    ncomp = image->numcomps;

    while (*tmp) {
        ++tmp;
    }
    tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if (want_gray) {
        ncomp = 1;
    }

    if ((force_split == 0) && ncomp >= 2 &&
            are_comps_similar(image)) {
        fdest = fopen(outfile, "wb");

        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w;
        hr = (int)image->comps[0].h;
        max = (1 << prec) - 1;
        has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;
        if (red == NULL) {
            fprintf(stderr,
                    "imagetopnm: planes[%d] == NULL.\n", 0);
            fprintf(stderr, "\tAborting\n");
            fclose(fdest);
            return fails;
        }

        if (triple) {
            green = image->comps[1].data;
            blue = image->comps[2].data;
            for (i = 1; i <= 2; i++) {
                if (image->comps[i].data == NULL) {
                    fprintf(stderr,
                            "imagetopnm: planes[%d] == NULL.\n", i);
                    fprintf(stderr, "\tAborting\n");
                    fclose(fdest);
                    return fails;
                }
            }
        } else {
            green = blue = NULL;
        }

        if (has_alpha) {
            const char *tt = (triple ? "RGB_ALPHA" : "GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                       1 << (image->comps[ncomp - 1].prec - 1) : 0);
        } else {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if (triple) {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        } else {
            adjustG = adjustB = 0;
        }

        for (i = 0; i < wr * hr; ++i) {
            if (two) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (triple) {
                    v = *green + adjustG;
                    ++green;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                    v =  *blue + adjustB;
                    ++blue;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                }/* if(triple) */

                if (has_alpha) {
                    v = *alpha + adjustA;
                    ++alpha;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
                continue;

            }   /* if(two) */

            /* prec <= 8: */
            v = *red++;
            if (v > 255) {
                v = 255;
            } else if (v < 0) {
                v = 0;
            }

            fprintf(fdest, "%c", (unsigned char)v);
            if (triple) {
                v = *green++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
            if (has_alpha) {
                v = *alpha++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }   /* for(i */

        fclose(fdest);
        return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp) {
        fprintf(stderr, "WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr, "           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if (destname == NULL) {
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++) {
        if (ncomp > 1) {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            memcpy(destname, outfile, dotpos);
            sprintf(destname + dotpos, "_%u.pgm", compno);
        } else {
            sprintf(destname, "%s", outfile);
        }

        fdest = fopen(destname, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w;
        hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1 << prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        if (!red) {
            fclose(fdest);
            continue;
        }

        adjustR =
            (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if (prec > 8) {
            for (i = 0; i < wr * hr; i++) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (has_alpha) {
                    v = *alpha++;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
            }/* for(i */
        } else { /* prec <= 8 */
            for (i = 0; i < wr * hr; ++i) {
                v = *red + adjustR;
                ++red;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}